

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveExprStep(Walker *pWalker,Expr *pExpr)

{
  RenameToken **ppRVar1;
  byte *pbVar2;
  byte bVar3;
  short sVar4;
  NameContext *pNVar5;
  Parse *pParse;
  ExprList *pEVar6;
  sqlite3 *db;
  _func_void_sqlite3_context_ptr *p_Var7;
  Db *pDVar8;
  SrcList *pSVar9;
  IdList *pIVar10;
  IdList_item *pIVar11;
  Upsert *pUVar12;
  Schema *pSVar13;
  u8 uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  size_t sVar20;
  FuncDef *pFunc;
  Expr *pEVar21;
  Select *pSVar22;
  RenameToken *pRVar23;
  Window *pWVar24;
  ushort uVar25;
  ushort uVar26;
  ulong uVar27;
  Expr *pEVar28;
  int iVar29;
  int iVar30;
  RenameToken *pRVar31;
  Schema **ppSVar32;
  char *pcVar33;
  char *pcVar34;
  uint uVar35;
  uint uVar36;
  SrcList_item *pSVar37;
  char *pcVar38;
  uint uVar39;
  char *zLeft;
  Schema *pSVar40;
  Column *pCVar41;
  char **ppcVar42;
  long lVar43;
  Table *pTVar44;
  NameContext *pNVar45;
  long lVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  Walker w;
  u8 local_109;
  NameContext *local_f8;
  int local_f0;
  char *local_e0;
  SrcList_item *local_d0;
  int *local_a8;
  Table **local_a0;
  int local_90;
  sqlite3 *local_88;
  SrcList *local_70;
  undefined8 local_68;
  Walker local_60;
  
  pNVar5 = (pWalker->u).pNC;
  pParse = pNVar5->pParse;
  bVar3 = pExpr->op;
  if (0x7e < bVar3) {
    if (bVar3 < 0x90) {
      if (bVar3 == 0x7f) goto switchD_0016bbca_caseD_31;
      if (bVar3 != 0x82) goto switchD_0016bbca_caseD_2e;
      pEVar28 = pExpr->pLeft;
      notValid(pParse,(NameContext *)(ulong)*(uint *)&pNVar5->ncFlags,"the \".\" operator",0x20);
      pEVar21 = pExpr->pRight;
      if (pEVar21->op == ';') {
        pcVar34 = (char *)0x0;
      }
      else {
        pcVar34 = (pEVar28->u).zToken;
        pEVar28 = pEVar21->pLeft;
        pEVar21 = pEVar21->pRight;
      }
      pcVar33 = (pEVar28->u).zToken;
      local_e0 = (pEVar21->u).zToken;
      if ((1 < pParse->eParseMode) &&
         (pRVar23 = pParse->pRename, pRVar31 = pRVar23, pRVar23 != (RenameToken *)0x0)) {
        do {
          if ((Expr *)pRVar31->p == pEVar21) {
            pRVar31->p = pExpr;
            pRVar23 = pParse->pRename;
            break;
          }
          ppRVar1 = &pRVar31->pNext;
          pRVar31 = *ppRVar1;
        } while (*ppRVar1 != (RenameToken *)0x0);
        if (pRVar23 != (RenameToken *)0x0) {
          do {
            if ((Expr *)pRVar23->p == pEVar28) {
              pRVar23->p = &pExpr->y;
              break;
            }
            pRVar23 = pRVar23->pNext;
          } while (pRVar23 != (RenameToken *)0x0);
        }
      }
      local_88 = pParse->db;
      pExpr->iTable = -1;
      if (pcVar34 == (char *)0x0) {
        pcVar34 = (char *)0x0;
LAB_0016c1a1:
        pSVar40 = (Schema *)0x0;
      }
      else if ((pNVar5->ncFlags & 6) == 0) {
        iVar15 = local_88->nDb;
        if ((long)iVar15 < 1) goto LAB_0016c1a1;
        pDVar8 = local_88->aDb;
        lVar46 = 0;
        do {
          iVar30 = sqlite3StrICmp(*(char **)((long)&pDVar8->zDbSName + lVar46),pcVar34);
          if (iVar30 == 0) {
            pSVar40 = *(Schema **)((long)&pDVar8->pSchema + lVar46);
            goto LAB_0016c202;
          }
          lVar46 = lVar46 + 0x20;
        } while ((long)iVar15 * 0x20 != lVar46);
        pSVar40 = (Schema *)0x0;
      }
      else {
        pSVar40 = (Schema *)0x0;
        pcVar34 = (char *)0x0;
      }
LAB_0016c202:
      local_a8 = &pExpr->iTable;
      local_a0 = &pParse->pTriggerTab;
      local_d0 = (SrcList_item *)0x0;
      local_109 = 0x9e;
      local_f0 = -1;
      local_90 = 0;
      iVar15 = 0;
      local_f8 = pNVar5;
      do {
        pSVar9 = local_f8->pSrcList;
        if (pSVar9 == (SrcList *)0x0) {
          iVar30 = 0;
        }
        else {
          iVar19 = pSVar9->nSrc;
          if (iVar19 < 1) {
            iVar30 = 0;
          }
          else {
            pSVar37 = pSVar9->a;
            iVar29 = 0;
            iVar30 = 0;
            do {
              pTVar44 = pSVar37->pTab;
              pSVar22 = pSVar37->pSelect;
              if ((pSVar22 == (Select *)0x0) || ((pSVar22->selFlags & 0x800) == 0)) {
LAB_0016c355:
                if ((pcVar34 == (char *)0x0) || (pTVar44->pSchema == pSVar40)) {
                  if (pcVar33 != (char *)0x0) {
                    pcVar38 = pSVar37->zAlias;
                    zLeft = pcVar38;
                    if (pcVar38 == (char *)0x0) {
                      zLeft = pTVar44->zName;
                    }
                    iVar16 = sqlite3StrICmp(zLeft,pcVar33);
                    if (iVar16 != 0) goto LAB_0016c4f5;
                    if ((pcVar38 != (char *)0x0) && (1 < pParse->eParseMode)) {
                      for (pRVar23 = pParse->pRename; pRVar23 != (RenameToken *)0x0;
                          pRVar23 = pRVar23->pNext) {
                        if ((anon_union_8_2_31fbcc88_for_y *)pRVar23->p == &pExpr->y) {
                          pRVar23->p = (void *)0x0;
                          break;
                        }
                      }
                    }
                  }
                  iVar16 = iVar15 + 1;
                  if (iVar15 == 0) {
                    local_d0 = pSVar37;
                  }
                  sVar4 = pTVar44->nCol;
                  iVar15 = iVar16;
                  if (0 < sVar4) {
                    pCVar41 = pTVar44->aCol;
                    iVar16 = 0;
                    do {
                      iVar17 = sqlite3StrICmp(pCVar41->zName,local_e0);
                      if (iVar17 == 0) {
                        if (iVar30 != 1) {
LAB_0016c4b2:
                          iVar30 = iVar30 + 1;
                          if (iVar16 == pTVar44->iPKey) {
                            iVar16 = 0xffff;
                          }
                          pExpr->iColumn = (ynVar)iVar16;
                          local_d0 = pSVar37;
                          break;
                        }
                        if (((pSVar37->fg).jointype & 4) == 0) {
                          pIVar10 = pSVar37->pUsing;
                          if ((pIVar10 == (IdList *)0x0) ||
                             (iVar17 = pIVar10->nId, (long)iVar17 < 1)) goto LAB_0016c4b2;
                          pIVar11 = pIVar10->a;
                          lVar46 = 0;
                          while (iVar18 = sqlite3StrICmp(*(char **)((long)&pIVar11->zName + lVar46),
                                                         local_e0), iVar18 != 0) {
                            lVar46 = lVar46 + 0x10;
                            if ((long)iVar17 * 0x10 == lVar46) goto LAB_0016c4b2;
                          }
                        }
                      }
                      iVar16 = iVar16 + 1;
                      pCVar41 = pCVar41 + 1;
                    } while (iVar16 != sVar4);
                  }
                }
              }
              else {
                lVar46 = (long)pSVar22->pEList->nExpr;
                bVar50 = false;
                if (0 < lVar46) {
                  ppcVar42 = &pSVar22->pEList->a[0].zSpan;
                  lVar43 = 0;
                  do {
                    iVar16 = sqlite3MatchSpanName(*ppcVar42,local_e0,pcVar33,pcVar34);
                    if (iVar16 != 0) {
                      iVar30 = iVar30 + 1;
                      pExpr->iColumn = (ynVar)lVar43;
                      iVar15 = 2;
                      bVar50 = true;
                      local_d0 = pSVar37;
                    }
                    lVar43 = lVar43 + 1;
                    ppcVar42 = ppcVar42 + 4;
                  } while (lVar46 != lVar43);
                }
                if (pcVar33 != (char *)0x0 && !bVar50) goto LAB_0016c355;
              }
LAB_0016c4f5:
              iVar29 = iVar29 + 1;
              pSVar37 = pSVar37 + 1;
            } while (iVar29 != iVar19);
          }
          if (local_d0 == (SrcList_item *)0x0) {
            local_d0 = (SrcList_item *)0x0;
          }
          else {
            local_f0 = local_d0->iCursor;
            *local_a8 = local_f0;
            pTVar44 = local_d0->pTab;
            (pExpr->y).pTab = pTVar44;
            if (((local_d0->fg).jointype & 8) != 0) {
              pbVar2 = (byte *)((long)&pExpr->flags + 2);
              *pbVar2 = *pbVar2 | 0x10;
            }
            pSVar40 = pTVar44->pSchema;
          }
        }
        if (iVar15 == 0 && (pcVar33 != (char *)0x0 && pcVar34 == (char *)0x0)) {
          pTVar44 = *local_a0;
          if (pTVar44 == (Table *)0x0) {
            pTVar44 = (Table *)0x0;
          }
          else {
            uVar14 = pParse->eTriggerOp;
            if (uVar14 == 'u') {
LAB_0016c5cb:
              iVar19 = sqlite3StrICmp("old",pcVar33);
              iVar15 = 0;
              if (iVar19 != 0) {
                pTVar44 = (Table *)0x0;
                goto LAB_0016c60d;
              }
            }
            else {
              iVar15 = sqlite3StrICmp("new",pcVar33);
              if (iVar15 != 0) {
                if (uVar14 == 't') {
                  pTVar44 = (Table *)0x0;
                  goto LAB_0016c60d;
                }
                goto LAB_0016c5cb;
              }
              iVar15 = 1;
            }
            local_f0 = iVar15;
            *local_a8 = local_f0;
          }
LAB_0016c60d:
          if ((((local_f8->ncFlags & 0x200) != 0) &&
              (pUVar12 = (local_f8->uNC).pUpsert, pUVar12 != (Upsert *)0x0)) &&
             (iVar15 = sqlite3StrICmp("excluded",pcVar33), iVar15 == 0)) {
            pTVar44 = pUVar12->pUpsertSrc->a[0].pTab;
            *local_a8 = 2;
            local_f0 = 2;
          }
          if (pTVar44 != (Table *)0x0) {
            pSVar40 = pTVar44->pSchema;
            uVar39 = (uint)pTVar44->nCol;
            if (pTVar44->nCol < 1) {
              uVar36 = 0;
LAB_0016c6b1:
              if ((int)uVar39 <= (int)uVar36) goto LAB_0016c6b5;
            }
            else {
              pCVar41 = pTVar44->aCol;
              uVar35 = 0;
              do {
                iVar15 = sqlite3StrICmp(pCVar41->zName,local_e0);
                if (iVar15 == 0) {
                  uVar36 = uVar35;
                  if ((int)pTVar44->iPKey == uVar35) {
                    uVar36 = 0xffffffff;
                  }
                  goto LAB_0016c6b1;
                }
                uVar35 = uVar35 + 1;
                pCVar41 = pCVar41 + 1;
                uVar36 = uVar39;
              } while (uVar39 != uVar35);
LAB_0016c6b5:
              iVar15 = sqlite3IsRowid(local_e0);
              if (iVar15 != 0) {
                uVar36 = uVar36 | -(uint)((pTVar44->tabFlags & 0x40) == 0);
              }
            }
            if ((int)uVar36 < (int)uVar39) {
              iVar30 = iVar30 + 1;
              if (local_f0 == 2) {
                if (pParse->eParseMode < 2) {
                  local_f0 = uVar36 + ((local_f8->uNC).pUpsert)->regData;
                  pExpr->iTable = local_f0;
                  pbVar2 = (byte *)((long)&pExpr->flags + 2);
                  *pbVar2 = *pbVar2 | 0x40;
                  local_109 = 0xa4;
                }
                else {
                  pExpr->iColumn = (ynVar)uVar36;
                  (pExpr->y).pTab = pTVar44;
                  local_109 = 0x9e;
                  local_f0 = 2;
                }
              }
              else {
                if ((int)uVar36 < 0) {
                  pExpr->affinity = 'D';
                }
                else {
                  uVar39 = 1 << ((byte)uVar36 & 0x1f);
                  if (0x1f < uVar36) {
                    uVar39 = 0xffffffff;
                  }
                  if (local_f0 == 0) {
                    pParse->oldmask = pParse->oldmask | uVar39;
                  }
                  else {
                    pParse->newmask = pParse->newmask | uVar39;
                  }
                }
                (pExpr->y).pTab = pTVar44;
                pExpr->iColumn = (ynVar)uVar36;
                local_109 = 'M';
              }
            }
            iVar15 = 1;
            goto LAB_0016c796;
          }
          iVar15 = 0;
LAB_0016c86a:
          if (iVar30 != 0) {
            if (iVar30 != 1) {
              pcVar38 = "ambiguous column name";
              goto LAB_0016c9a1;
            }
LAB_0016c8ec:
            bVar50 = true;
            goto LAB_0016ca54;
          }
        }
        else {
LAB_0016c796:
          uVar26 = local_f8->ncFlags;
          if ((((iVar30 == 0) && (iVar15 == 1)) &&
              ((local_d0 != (SrcList_item *)0x0 &&
               ((iVar15 = 1, (uVar26 & 0x20) == 0 &&
                (iVar19 = sqlite3IsRowid(local_e0), iVar19 != 0)))))) &&
             ((local_d0->pTab->tabFlags & 0x40) == 0)) {
            pExpr->iColumn = -1;
            pExpr->affinity = 'D';
            goto LAB_0016c8ec;
          }
          if (((pcVar33 != (char *)0x0) || (iVar30 != 0)) || ((uVar26 & 0x80) == 0))
          goto LAB_0016c86a;
          pEVar6 = (local_f8->uNC).pEList;
          iVar30 = pEVar6->nExpr;
          if (0 < (long)iVar30) {
            ppcVar42 = &pEVar6->a[0].zName;
            lVar46 = 0;
            do {
              pcVar38 = *ppcVar42;
              if ((pcVar38 != (char *)0x0) &&
                 (iVar19 = sqlite3StrICmp(pcVar38,local_e0), iVar19 == 0)) {
                pEVar28 = ((ExprList_item *)(ppcVar42 + -1))->pExpr;
                if (((uVar26 & 1) == 0) && ((pEVar28->flags & 2) != 0)) {
                  sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s",pcVar38);
                  return 2;
                }
                uVar14 = pEVar28->op;
                if (uVar14 == 0xa4) {
                  uVar14 = pEVar28->op2;
                }
                if (uVar14 == '\x7f') {
                  pSVar22 = (pEVar28->x).pSelect;
LAB_0016c901:
                  if (((anon_union_8_2_a01b6dbf_for_x *)&pSVar22->pEList)->pList->nExpr != 1) {
                    sqlite3ErrorMsg(pParse,"row value misused");
                    return 2;
                  }
                }
                else if (uVar14 == 0xa5) {
                  pSVar22 = (Select *)&pEVar28->x;
                  goto LAB_0016c901;
                }
                resolveAlias(pParse,pEVar6,(int)lVar46,pExpr,"",local_90);
                if ((pParse->eParseMode < 2) ||
                   (pRVar23 = pParse->pRename, pRVar23 == (RenameToken *)0x0)) goto LAB_0016cae6;
                goto LAB_0016c950;
              }
              lVar46 = lVar46 + 1;
              ppcVar42 = ppcVar42 + 4;
            } while (iVar30 != lVar46);
          }
        }
        local_f8 = local_f8->pNext;
        local_90 = local_90 + 1;
      } while (local_f8 != (NameContext *)0x0);
      pcVar38 = "no such column";
      if (pcVar33 == (char *)0x0) {
        if ((pExpr->flags & 0x40) != 0) {
          pExpr->op = 'j';
          (pExpr->y).pTab = (Table *)0x0;
          return 1;
        }
        iVar15 = sqlite3ExprIdToTrueFalse(pExpr);
        if (iVar15 != 0) {
          return 1;
        }
        local_f8 = (NameContext *)0x0;
      }
      else {
        local_f8 = (NameContext *)0x0;
      }
LAB_0016c9a1:
      if (pcVar34 == (char *)0x0) {
        if (pcVar33 == (char *)0x0) {
          sqlite3ErrorMsg(pParse,"%s: %s",pcVar38,local_e0);
        }
        else {
          sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar38,pcVar33,local_e0);
        }
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar38,pcVar34,pcVar33,local_e0);
      }
      pParse->checkSchema = '\x01';
      pNVar5->nErr = pNVar5->nErr + 1;
      bVar50 = false;
LAB_0016ca54:
      uVar26 = pExpr->iColumn;
      if ((-1 < (short)uVar26) && (local_d0 != (SrcList_item *)0x0)) {
        uVar25 = 0x3f;
        if (uVar26 < 0x3f) {
          uVar25 = uVar26;
        }
        local_d0->colUsed = local_d0->colUsed | 1L << ((byte)uVar25 & 0x3f);
      }
      if (pExpr->pLeft != (Expr *)0x0) {
        sqlite3ExprDeleteNN(local_88,pExpr->pLeft);
      }
      pExpr->pLeft = (Expr *)0x0;
      if (pExpr->pRight != (Expr *)0x0) {
        sqlite3ExprDeleteNN(local_88,pExpr->pRight);
      }
      pExpr->pRight = (Expr *)0x0;
      pExpr->op = local_109;
      pbVar2 = (byte *)((long)&pExpr->flags + 2);
      *pbVar2 = *pbVar2 | 0x80;
      if (!bVar50) {
        return 2;
      }
LAB_0016cae6:
      if ((((pExpr->flags & 0x400000) == 0) && (pSVar40 != (Schema *)0x0)) &&
         (pParse->db->xAuth != (sqlite3_xauth)0x0)) {
        iVar15 = -1;
        ppSVar32 = &pParse->db->aDb->pSchema;
        do {
          iVar15 = iVar15 + 1;
          pSVar13 = *ppSVar32;
          ppSVar32 = ppSVar32 + 4;
        } while (pSVar13 != pSVar40);
        if (pExpr->op == 'M') {
LAB_0016cb43:
          pTVar44 = *local_a0;
          if (pTVar44 != (Table *)0x0) {
            lVar46 = (long)pExpr->iColumn;
            if ((pExpr->iColumn < 0) && (lVar46 = (long)pTVar44->iPKey, lVar46 < 0)) {
              pcVar34 = "ROWID";
            }
            else {
              pcVar34 = pTVar44->aCol[lVar46].zName;
            }
            iVar15 = sqlite3AuthReadCol(pParse,pTVar44->zName,pcVar34,iVar15);
            if (iVar15 == 2) {
              pExpr->op = 'n';
            }
          }
        }
        else {
          lVar46 = (long)local_f8->pSrcList->nSrc;
          if (0 < lVar46) {
            local_a0 = &local_f8->pSrcList->a[0].pTab;
            do {
              if (*local_a8 == *(int *)(local_a0 + 4)) goto LAB_0016cb43;
              local_a0 = local_a0 + 0xe;
              lVar46 = lVar46 + -1;
            } while (lVar46 != 0);
          }
        }
      }
      pNVar5->nRef = pNVar5->nRef + 1;
      while (local_f8 != pNVar5) {
        pNVar5 = pNVar5->pNext;
        pNVar5->nRef = pNVar5->nRef + 1;
      }
      return 1;
    }
    if (bVar3 == 0x90) {
      notValid(pParse,(NameContext *)(ulong)*(uint *)&pNVar5->ncFlags,"parameters",0x26);
      goto switchD_0016bbca_caseD_2e;
    }
    if (bVar3 == 0x9c) goto switchD_0016bbca_caseD_2d;
    if (bVar3 != 0x9d) goto switchD_0016bbca_caseD_2e;
    pEVar6 = (pExpr->x).pList;
    uVar27 = 0;
    iVar15 = 0;
    if (pEVar6 != (ExprList *)0x0) {
      iVar15 = pEVar6->nExpr;
    }
    db = pParse->db;
    uVar14 = db->enc;
    pcVar34 = (pExpr->u).zToken;
    if (pcVar34 != (char *)0x0) {
      sVar20 = strlen(pcVar34);
      uVar27 = (ulong)((uint)sVar20 & 0x3fffffff);
    }
    pFunc = sqlite3FindFunction(db,pcVar34,iVar15,uVar14,'\0');
    if (pFunc == (FuncDef *)0x0) {
      bVar47 = false;
      pFunc = sqlite3FindFunction(pParse->db,pcVar34,-2,uVar14,'\0');
      bVar48 = pFunc == (FuncDef *)0x0;
      bVar50 = !bVar48;
      if (1 < pParse->eParseMode) goto LAB_0016ce0d;
LAB_0016c0e5:
      if (((pFunc != (FuncDef *)0x0) && (pFunc->xValue == (_func_void_sqlite3_context_ptr *)0x0)) &&
         ((pExpr->flags & 0x1000000) != 0)) {
        pcVar33 = "%.*s() may not be used as a window function";
        goto LAB_0016cc93;
      }
      if (bVar47) {
        if ((pNVar5->ncFlags & 1) != 0) {
          if ((pFunc->funcFlags >> 0x10 & 1) == 0) {
            bVar49 = (pExpr->y).pTab != (Table *)0x0;
          }
          else {
            bVar49 = true;
            if ((pExpr->y).pTab == (Table *)0x0) goto LAB_0016cc2f;
          }
          if (!bVar49 || ((byte)(pNVar5->ncFlags >> 0xe) & 1) != 0) goto LAB_0016cc5a;
        }
LAB_0016cc2f:
        if ((pFunc->funcFlags >> 0x10 & 1) == 0) {
          pcVar33 = "window";
          if ((pExpr->y).pTab == (Table *)0x0) {
            pcVar33 = "aggregate";
          }
        }
        else {
          pcVar33 = "window";
        }
        sqlite3ErrorMsg(pParse,"misuse of %s function %.*s()",pcVar33,uVar27,pcVar34);
        pNVar5->nErr = pNVar5->nErr + 1;
        goto LAB_0016ce0d;
      }
LAB_0016cc5a:
      if (bVar50) {
        if (!bVar48) {
          pcVar33 = "wrong number of arguments to function %.*s()";
LAB_0016cc93:
          sqlite3ErrorMsg(pParse,pcVar33,uVar27,pcVar34);
          pNVar5->nErr = pNVar5->nErr + 1;
        }
      }
      else {
        bVar50 = (pParse->db->init).busy != '\0';
        pcVar33 = "no such function: %.*s";
        if (bVar50) {
          pcVar33 = "wrong number of arguments to function %.*s()";
        }
        if (!(bool)(bVar50 & bVar48)) goto LAB_0016cc93;
      }
      if (!bVar47) {
LAB_0016ce0d:
        sqlite3WalkExprList(pWalker,pEVar6);
        return 1;
      }
      uVar26 = 0xbfff;
      if ((pExpr->y).pTab == (Table *)0x0) {
        uVar26 = 0xfffe;
      }
      pNVar5->ncFlags = pNVar5->ncFlags & uVar26;
      sqlite3WalkExprList(pWalker,pEVar6);
    }
    else {
      p_Var7 = pFunc->xFinalize;
      bVar47 = p_Var7 != (_func_void_sqlite3_context_ptr *)0x0;
      if ((pFunc->funcFlags & 0x400) != 0) {
        pExpr->flags = pExpr->flags | 0x41000;
        if (iVar15 == 2) {
          iVar15 = exprProbability(*(Expr **)(pEVar6 + 1));
          pExpr->iTable = iVar15;
          if (iVar15 < 0) {
            sqlite3ErrorMsg(pParse,
                            "second argument to likelihood() must be a constant between 0.0 and 1.0"
                           );
            pNVar5->nErr = pNVar5->nErr + 1;
          }
        }
        else {
          iVar15 = 0x7800000;
          if (*pFunc->zName == 'u') {
            iVar15 = 0x800000;
          }
          pExpr->iTable = iVar15;
        }
      }
      iVar15 = sqlite3AuthCheck(pParse,0x1f,(char *)0x0,pFunc->zName,(char *)0x0);
      if (iVar15 != 0) {
        if (iVar15 == 1) {
          sqlite3ErrorMsg(pParse,"not authorized to use function: %s",pFunc->zName);
          pNVar5->nErr = pNVar5->nErr + 1;
        }
        pExpr->op = 'n';
        return 1;
      }
      uVar39 = pFunc->funcFlags;
      if ((uVar39 & 0x2800) != 0) {
        pbVar2 = (byte *)((long)&pExpr->flags + 2);
        *pbVar2 = *pbVar2 | 8;
      }
      if ((uVar39 >> 0xb & 1) == 0) {
        notValid(pParse,(NameContext *)(ulong)*(uint *)&pNVar5->ncFlags,
                 "non-deterministic functions",0x22);
        uVar39 = pFunc->funcFlags;
      }
      bVar48 = true;
      bVar50 = true;
      if (((uVar39 >> 0x12 & 1) != 0) &&
         (bVar49 = pParse->nested != '\0', bVar50 = sqlite3Config.bInternalFunctions != 0 || bVar49,
         sqlite3Config.bInternalFunctions == 0 && !bVar49)) {
        pFunc = (FuncDef *)0x0;
      }
      if (pParse->eParseMode < 2) goto LAB_0016c0e5;
      sqlite3WalkExprList(pWalker,pEVar6);
      if (p_Var7 == (_func_void_sqlite3_context_ptr *)0x0) {
        return 1;
      }
    }
    if ((pExpr->y).pWin == (Window *)0x0) {
      pExpr->op = 0x9f;
      pExpr->op2 = '\0';
      pNVar45 = pNVar5;
      while( true ) {
        local_70 = pNVar45->pSrcList;
        local_60.xExprCallback = exprSrcCount;
        local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
        local_68 = 0;
        local_60.u.pNC = (NameContext *)&local_70;
        sqlite3WalkExprList(&local_60,(pExpr->x).pList);
        if ((0 < (int)local_68) || (local_68._4_4_ == 0)) break;
        pExpr->op2 = pExpr->op2 + '\x01';
        pNVar45 = pNVar45->pNext;
        if (pNVar45 == (NameContext *)0x0) {
LAB_0016ce49:
          *(byte *)&pNVar5->ncFlags = (byte)pNVar5->ncFlags | 1;
          return 1;
        }
      }
      pNVar45->ncFlags = (ushort)pFunc->funcFlags & 0x1000 | pNVar45->ncFlags | 0x10;
      goto LAB_0016ce49;
    }
    pSVar22 = pNVar5->pWinSelect;
    sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pPartition);
    sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pOrderBy);
    pWVar24 = (pExpr->y).pWin;
    if (pWVar24->pFilter != (Expr *)0x0) {
      walkExpr(pWalker,pWVar24->pFilter);
      pWVar24 = (pExpr->y).pWin;
    }
    sqlite3WindowUpdate(pParse,pSVar22->pWinDefn,pWVar24,pFunc);
    if (pSVar22->pWin == (Window *)0x0) {
      pWVar24 = (Window *)0x0;
    }
    else {
      iVar15 = sqlite3WindowCompare(pParse,pSVar22->pWin,(pExpr->y).pWin);
      if (iVar15 != 0) goto LAB_0016ce26;
      pWVar24 = pSVar22->pWin;
    }
    ((pExpr->y).pTab)->pCheck = (ExprList *)pWVar24;
    pSVar22->pWin = (Window *)pExpr->y;
LAB_0016ce26:
    pbVar2 = (byte *)((long)&pNVar5->ncFlags + 1);
    *pbVar2 = *pbVar2 | 0x40;
    return 1;
  }
  switch(bVar3) {
  case 0x2d:
    goto switchD_0016bbca_caseD_2d;
  case 0x2e:
  case 0x2f:
  case 0x32:
  case 0x33:
  case 0x3a:
    goto switchD_0016bbca_caseD_2e;
  case 0x30:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto switchD_0016bbca_caseD_30;
  case 0x31:
    goto switchD_0016bbca_caseD_31;
  case 0x3b:
    local_e0 = (pExpr->u).zToken;
    local_88 = pParse->db;
    pExpr->iTable = -1;
    pcVar33 = (char *)0x0;
    pSVar40 = (Schema *)0x0;
    pcVar34 = (char *)0x0;
    goto LAB_0016c202;
  default:
    if (bVar3 != 0x14) goto switchD_0016bbca_caseD_2e;
    goto switchD_0016bbca_caseD_31;
  }
  while (pRVar23 = pRVar23->pNext, pRVar23 != (RenameToken *)0x0) {
LAB_0016c950:
    if ((Expr *)pRVar23->p == pExpr) {
      pRVar23->p = (void *)0x0;
      break;
    }
  }
  goto LAB_0016cae6;
switchD_0016bbca_caseD_31:
  if ((pExpr->flags & 0x800) != 0) {
    iVar15 = pNVar5->nRef;
    notValid(pParse,(NameContext *)(ulong)*(uint *)&pNVar5->ncFlags,"subqueries",0x26);
    sqlite3WalkSelect(pWalker,(pExpr->x).pSelect);
    if (iVar15 != pNVar5->nRef) {
      *(byte *)&pExpr->flags = (byte)pExpr->flags | 0x20;
      *(byte *)&pNVar5->ncFlags = (byte)pNVar5->ncFlags | 0x40;
    }
  }
  goto switchD_0016bbca_caseD_2e;
switchD_0016bbca_caseD_2d:
  pEVar28 = pExpr->pRight;
  if (pEVar28->op == ';') {
    iVar15 = resolveExprStep(pWalker,pEVar28);
    if (iVar15 == 2) {
      return 2;
    }
    if (pEVar28->op == 0x9b) {
      pExpr->op2 = pExpr->op;
      pExpr->op = 0xa3;
      return 0;
    }
  }
switchD_0016bbca_caseD_30:
  if (pParse->db->mallocFailed != '\0') goto switchD_0016bbca_caseD_2e;
  pEVar28 = pExpr->pLeft;
  uVar14 = pEVar28->op;
  if (uVar14 == 0xa4) {
    uVar14 = pEVar28->op2;
  }
  if (uVar14 == '\x7f') {
    pSVar22 = (pEVar28->x).pSelect;
LAB_0016be18:
    iVar15 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar22->pEList)->pList->nExpr;
  }
  else {
    iVar15 = 1;
    if (uVar14 == 0xa5) {
      pSVar22 = (Select *)&pEVar28->x;
      goto LAB_0016be18;
    }
  }
  if (pExpr->op == '0') {
    pEVar28 = ((pExpr->x).pList)->a[0].pExpr;
    uVar14 = pEVar28->op;
    if (uVar14 == 0xa4) {
      uVar14 = pEVar28->op2;
    }
    if (uVar14 == '\x7f') {
      pSVar22 = (pEVar28->x).pSelect;
LAB_0016beb3:
      iVar30 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar22->pEList)->pList->nExpr;
    }
    else {
      iVar30 = 1;
      if (uVar14 == 0xa5) {
        pSVar22 = (Select *)&pEVar28->x;
        goto LAB_0016beb3;
      }
    }
    if (iVar30 == iVar15) {
      pEVar28 = *(Expr **)((pExpr->x).pList + 1);
      goto LAB_0016bec0;
    }
  }
  else {
    pEVar28 = pExpr->pRight;
LAB_0016bec0:
    uVar14 = pEVar28->op;
    if (uVar14 == 0xa4) {
      uVar14 = pEVar28->op2;
    }
    if (uVar14 == '\x7f') {
      pSVar22 = (pEVar28->x).pSelect;
    }
    else {
      iVar30 = 1;
      if (uVar14 != 0xa5) goto LAB_0016beee;
      pSVar22 = (Select *)&pEVar28->x;
    }
    iVar30 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar22->pEList)->pList->nExpr;
  }
LAB_0016beee:
  if (iVar15 != iVar30) {
    sqlite3ErrorMsg(pParse,"row value misused");
  }
switchD_0016bbca_caseD_2e:
  iVar15 = 2;
  if (pParse->nErr == 0) {
    iVar15 = (uint)(pParse->db->mallocFailed != '\0') * 2;
  }
  return iVar15;
}

Assistant:

static int resolveExprStep(Walker *pWalker, Expr *pExpr){
  NameContext *pNC;
  Parse *pParse;

  pNC = pWalker->u.pNC;
  assert( pNC!=0 );
  pParse = pNC->pParse;
  assert( pParse==pWalker->pParse );

#ifndef NDEBUG
  if( pNC->pSrcList && pNC->pSrcList->nAlloc>0 ){
    SrcList *pSrcList = pNC->pSrcList;
    int i;
    for(i=0; i<pNC->pSrcList->nSrc; i++){
      assert( pSrcList->a[i].iCursor>=0 && pSrcList->a[i].iCursor<pParse->nTab);
    }
  }
#endif
  switch( pExpr->op ){

#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) && !defined(SQLITE_OMIT_SUBQUERY)
    /* The special operator TK_ROW means use the rowid for the first
    ** column in the FROM clause.  This is used by the LIMIT and ORDER BY
    ** clause processing on UPDATE and DELETE statements.
    */
    case TK_ROW: {
      SrcList *pSrcList = pNC->pSrcList;
      struct SrcList_item *pItem;
      assert( pSrcList && pSrcList->nSrc==1 );
      pItem = pSrcList->a;
      assert( HasRowid(pItem->pTab) && pItem->pTab->pSelect==0 );
      pExpr->op = TK_COLUMN;
      pExpr->y.pTab = pItem->pTab;
      pExpr->iTable = pItem->iCursor;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
      break;
    }
#endif /* defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
          && !defined(SQLITE_OMIT_SUBQUERY) */

    /* A column name:                    ID
    ** Or table name and column name:    ID.ID
    ** Or a database, table and column:  ID.ID.ID
    **
    ** The TK_ID and TK_OUT cases are combined so that there will only
    ** be one call to lookupName().  Then the compiler will in-line 
    ** lookupName() for a size reduction and performance increase.
    */
    case TK_ID:
    case TK_DOT: {
      const char *zColumn;
      const char *zTable;
      const char *zDb;
      Expr *pRight;

      if( pExpr->op==TK_ID ){
        zDb = 0;
        zTable = 0;
        zColumn = pExpr->u.zToken;
      }else{
        Expr *pLeft = pExpr->pLeft;
        notValid(pParse, pNC, "the \".\" operator", NC_IdxExpr);
        pRight = pExpr->pRight;
        if( pRight->op==TK_ID ){
          zDb = 0;
        }else{
          assert( pRight->op==TK_DOT );
          zDb = pLeft->u.zToken;
          pLeft = pRight->pLeft;
          pRight = pRight->pRight;
        }
        zTable = pLeft->u.zToken;
        zColumn = pRight->u.zToken;
        if( IN_RENAME_OBJECT ){
          sqlite3RenameTokenRemap(pParse, (void*)pExpr, (void*)pRight);
          sqlite3RenameTokenRemap(pParse, (void*)&pExpr->y.pTab, (void*)pLeft);
        }
      }
      return lookupName(pParse, zDb, zTable, zColumn, pNC, pExpr);
    }

    /* Resolve function names
    */
    case TK_FUNCTION: {
      ExprList *pList = pExpr->x.pList;    /* The argument list */
      int n = pList ? pList->nExpr : 0;    /* Number of arguments */
      int no_such_func = 0;       /* True if no such function exists */
      int wrong_num_args = 0;     /* True if wrong number of arguments */
      int is_agg = 0;             /* True if is an aggregate function */
      int nId;                    /* Number of characters in function name */
      const char *zId;            /* The function name. */
      FuncDef *pDef;              /* Information about the function */
      u8 enc = ENC(pParse->db);   /* The database encoding */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(pParse->db, zId, n, enc, 0);
      if( pDef==0 ){
        pDef = sqlite3FindFunction(pParse->db, zId, -2, enc, 0);
        if( pDef==0 ){
          no_such_func = 1;
        }else{
          wrong_num_args = 1;
        }
      }else{
        is_agg = pDef->xFinalize!=0;
        if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
          ExprSetProperty(pExpr, EP_Unlikely|EP_Skip);
          if( n==2 ){
            pExpr->iTable = exprProbability(pList->a[1].pExpr);
            if( pExpr->iTable<0 ){
              sqlite3ErrorMsg(pParse,
                "second argument to likelihood() must be a "
                "constant between 0.0 and 1.0");
              pNC->nErr++;
            }
          }else{
            /* EVIDENCE-OF: R-61304-29449 The unlikely(X) function is
            ** equivalent to likelihood(X, 0.0625).
            ** EVIDENCE-OF: R-01283-11636 The unlikely(X) function is
            ** short-hand for likelihood(X,0.0625).
            ** EVIDENCE-OF: R-36850-34127 The likely(X) function is short-hand
            ** for likelihood(X,0.9375).
            ** EVIDENCE-OF: R-53436-40973 The likely(X) function is equivalent
            ** to likelihood(X,0.9375). */
            /* TUNING: unlikely() probability is 0.0625.  likely() is 0.9375 */
            pExpr->iTable = pDef->zName[0]=='u' ? 8388608 : 125829120;
          }             
        }
#ifndef SQLITE_OMIT_AUTHORIZATION
        {
          int auth = sqlite3AuthCheck(pParse, SQLITE_FUNCTION, 0,pDef->zName,0);
          if( auth!=SQLITE_OK ){
            if( auth==SQLITE_DENY ){
              sqlite3ErrorMsg(pParse, "not authorized to use function: %s",
                                      pDef->zName);
              pNC->nErr++;
            }
            pExpr->op = TK_NULL;
            return WRC_Prune;
          }
        }
#endif
        if( pDef->funcFlags & (SQLITE_FUNC_CONSTANT|SQLITE_FUNC_SLOCHNG) ){
          /* For the purposes of the EP_ConstFunc flag, date and time
          ** functions and other functions that change slowly are considered
          ** constant because they are constant for the duration of one query */
          ExprSetProperty(pExpr,EP_ConstFunc);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_CONSTANT)==0 ){
          /* Date/time functions that use 'now', and other functions like
          ** sqlite_version() that might change over time cannot be used
          ** in an index. */
          notValid(pParse, pNC, "non-deterministic functions",
                   NC_IdxExpr|NC_PartIdx);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_INTERNAL)!=0
         && pParse->nested==0
         && sqlite3Config.bInternalFunctions==0
        ){
          /* Internal-use-only functions are disallowed unless the
          ** SQL is being compiled using sqlite3NestedParse() */
          no_such_func = 1;
          pDef = 0;
        }
      }

      if( 0==IN_RENAME_OBJECT ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        assert( is_agg==0 || (pDef->funcFlags & SQLITE_FUNC_MINMAX)
          || (pDef->xValue==0 && pDef->xInverse==0)
          || (pDef->xValue && pDef->xInverse && pDef->xSFunc && pDef->xFinalize)
        );
        if( pDef && pDef->xValue==0 && ExprHasProperty(pExpr, EP_WinFunc) ){
          sqlite3ErrorMsg(pParse, 
              "%.*s() may not be used as a window function", nId, zId
          );
          pNC->nErr++;
        }else if( 
              (is_agg && (pNC->ncFlags & NC_AllowAgg)==0)
           || (is_agg && (pDef->funcFlags&SQLITE_FUNC_WINDOW) && !pExpr->y.pWin)
           || (is_agg && pExpr->y.pWin && (pNC->ncFlags & NC_AllowWin)==0)
        ){
          const char *zType;
          if( (pDef->funcFlags & SQLITE_FUNC_WINDOW) || pExpr->y.pWin ){
            zType = "window";
          }else{
            zType = "aggregate";
          }
          sqlite3ErrorMsg(pParse, "misuse of %s function %.*s()",zType,nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#else
        if( (is_agg && (pNC->ncFlags & NC_AllowAgg)==0) ){
          sqlite3ErrorMsg(pParse,"misuse of aggregate function %.*s()",nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#endif
        else if( no_such_func && pParse->db->init.busy==0
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
                  && pParse->explain==0
#endif
        ){
          sqlite3ErrorMsg(pParse, "no such function: %.*s", nId, zId);
          pNC->nErr++;
        }else if( wrong_num_args ){
          sqlite3ErrorMsg(pParse,"wrong number of arguments to function %.*s()",
               nId, zId);
          pNC->nErr++;
        }
        if( is_agg ){
#ifndef SQLITE_OMIT_WINDOWFUNC
          pNC->ncFlags &= ~(pExpr->y.pWin ? NC_AllowWin : NC_AllowAgg);
#else
          pNC->ncFlags &= ~NC_AllowAgg;
#endif
        }
      }
      sqlite3WalkExprList(pWalker, pList);
      if( is_agg ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( pExpr->y.pWin ){
          Select *pSel = pNC->pWinSelect;
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pPartition);
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pOrderBy);
          sqlite3WalkExpr(pWalker, pExpr->y.pWin->pFilter);
          sqlite3WindowUpdate(pParse, pSel->pWinDefn, pExpr->y.pWin, pDef);
          if( 0==pSel->pWin 
           || 0==sqlite3WindowCompare(pParse, pSel->pWin, pExpr->y.pWin) 
          ){
            pExpr->y.pWin->pNextWin = pSel->pWin;
            pSel->pWin = pExpr->y.pWin;
          }
          pNC->ncFlags |= NC_AllowWin;
        }else
#endif /* SQLITE_OMIT_WINDOWFUNC */
        {
          NameContext *pNC2 = pNC;
          pExpr->op = TK_AGG_FUNCTION;
          pExpr->op2 = 0;
          while( pNC2 && !sqlite3FunctionUsesThisSrc(pExpr, pNC2->pSrcList) ){
            pExpr->op2++;
            pNC2 = pNC2->pNext;
          }
          assert( pDef!=0 );
          if( pNC2 ){
            assert( SQLITE_FUNC_MINMAX==NC_MinMaxAgg );
            testcase( (pDef->funcFlags & SQLITE_FUNC_MINMAX)!=0 );
            pNC2->ncFlags |= NC_HasAgg | (pDef->funcFlags & SQLITE_FUNC_MINMAX);

          }
          pNC->ncFlags |= NC_AllowAgg;
        }
      }
      /* FIX ME:  Compute pExpr->affinity based on the expected return
      ** type of the function 
      */
      return WRC_Prune;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT:
    case TK_EXISTS:  testcase( pExpr->op==TK_EXISTS );
#endif
    case TK_IN: {
      testcase( pExpr->op==TK_IN );
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        int nRef = pNC->nRef;
        notValid(pParse, pNC, "subqueries", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
        sqlite3WalkSelect(pWalker, pExpr->x.pSelect);
        assert( pNC->nRef>=nRef );
        if( nRef!=pNC->nRef ){
          ExprSetProperty(pExpr, EP_VarSelect);
          pNC->ncFlags |= NC_VarSelect;
        }
      }
      break;
    }
    case TK_VARIABLE: {
      notValid(pParse, pNC, "parameters", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      Expr *pRight;
      assert( !ExprHasProperty(pExpr, EP_Reduced) );
      /* Handle special cases of "x IS TRUE", "x IS FALSE", "x IS NOT TRUE",
      ** and "x IS NOT FALSE". */
      if( (pRight = pExpr->pRight)->op==TK_ID ){
        int rc = resolveExprStep(pWalker, pRight);
        if( rc==WRC_Abort ) return WRC_Abort;
        if( pRight->op==TK_TRUEFALSE ){
          pExpr->op2 = pExpr->op;
          pExpr->op = TK_TRUTH;
          return WRC_Continue;
        }
      }
      /* Fall thru */
    }
    case TK_BETWEEN:
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE: {
      int nLeft, nRight;
      if( pParse->db->mallocFailed ) break;
      assert( pExpr->pLeft!=0 );
      nLeft = sqlite3ExprVectorSize(pExpr->pLeft);
      if( pExpr->op==TK_BETWEEN ){
        nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[0].pExpr);
        if( nRight==nLeft ){
          nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[1].pExpr);
        }
      }else{
        assert( pExpr->pRight!=0 );
        nRight = sqlite3ExprVectorSize(pExpr->pRight);
      }
      if( nLeft!=nRight ){
        testcase( pExpr->op==TK_EQ );
        testcase( pExpr->op==TK_NE );
        testcase( pExpr->op==TK_LT );
        testcase( pExpr->op==TK_LE );
        testcase( pExpr->op==TK_GT );
        testcase( pExpr->op==TK_GE );
        testcase( pExpr->op==TK_IS );
        testcase( pExpr->op==TK_ISNOT );
        testcase( pExpr->op==TK_BETWEEN );
        sqlite3ErrorMsg(pParse, "row value misused");
      }
      break; 
    }
  }
  return (pParse->nErr || pParse->db->mallocFailed) ? WRC_Abort : WRC_Continue;
}